

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatfoe.c
# Opt level: O0

int ecx_FOEwrite(ecx_contextt *context,uint16 slave,char *filename,uint32 password,int psize,void *p
                ,int timeout)

{
  bool bVar1;
  bool bVar2;
  uint8 uVar3;
  ushort uVar4;
  size_t sVar5;
  uint local_860;
  int tsize;
  uint8 local_854;
  boolean dofinalzero;
  boolean worktodo;
  uint8 cnt;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  ushort local_4e;
  int segmentdata;
  uint16 maxdata;
  uint16 fnsize;
  int32 sendpacket;
  int32 packetnumber;
  int wkc;
  ec_FOEt *aFOEp;
  ec_FOEt *FOEp;
  void *p_local;
  int psize_local;
  uint32 password_local;
  char *filename_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  segmentdata = 0;
  ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),0);
  ec_clearmbx((ec_mbxbuft *)&tsize);
  bVar2 = false;
  sVar5 = strlen(filename);
  uVar4 = context->slavelist[slave].mbx_l - 0xc;
  local_4e = (ushort)sVar5;
  if (uVar4 < (ushort)sVar5) {
    local_4e = uVar4;
  }
  tsize._0_2_ = local_4e + 6;
  tsize._2_2_ = 0;
  local_854 = '\0';
  uVar3 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
  context->slavelist[slave].mbx_cnt = uVar3;
  dofinalzero = uVar3 * '\x10' + '\x04';
  worktodo = '\x02';
  MbxOut._0_4_ = password;
  memcpy(MbxOut + 4,filename,(ulong)local_4e);
  sendpacket = ecx_mbxsend(context,slave,(ec_mbxbuft *)&tsize,20000);
  FOEp = (ec_FOEt *)p;
  p_local._0_4_ = psize;
  if (0 < sendpacket) {
    do {
      bVar1 = false;
      ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
      sendpacket = ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),timeout);
      if (0 < sendpacket) {
        if ((MbxOut[0x3fd] & 0xf) == 4) {
          if (MbxOut[0x3fe] == '\x04') {
            if (MbxIn._0_4_ == segmentdata) {
              if (context->FOEhook != (_func_int_uint16_int_int *)0x0) {
                (*context->FOEhook)(slave,MbxIn._0_4_,(uint)p_local);
              }
              local_860 = (uint)p_local;
              if ((int)(uint)uVar4 < (int)(uint)p_local) {
                local_860 = (uint)uVar4;
              }
              if ((local_860 != 0) || (bVar2)) {
                bVar2 = false;
                MbxIn[0x3fc] = (undefined1)local_860;
                MbxIn[0x3fd] = local_860._1_1_;
                MbxIn[0x3fe] = local_860._2_1_;
                MbxIn[0x3ff] = local_860._3_1_;
                p_local._0_4_ = (uint)p_local - local_860;
                if (((uint)p_local == 0) && (local_860 == uVar4)) {
                  bVar2 = true;
                }
                tsize._0_2_ = (short)local_860 + 6;
                tsize._2_2_ = 0;
                local_854 = '\0';
                uVar3 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                context->slavelist[slave].mbx_cnt = uVar3;
                dofinalzero = uVar3 * '\x10' + '\x04';
                worktodo = '\x03';
                segmentdata = segmentdata + 1;
                MbxOut._0_4_ = segmentdata;
                memcpy(MbxOut + 4,FOEp,(long)(int)local_860);
                FOEp = (ec_FOEt *)((long)&(FOEp->MbxHeader).length + (long)(int)local_860);
                sendpacket = ecx_mbxsend(context,slave,(ec_mbxbuft *)&tsize,20000);
                bVar1 = 0 < sendpacket;
              }
            }
            else {
              sendpacket = -7;
            }
          }
          else if (MbxOut[0x3fe] == '\x05') {
            sendpacket = -5;
          }
          else if (MbxOut[0x3fe] == '\x06') {
            if (segmentdata != 0) {
              if ((uint)p_local == 0) {
                bVar2 = true;
              }
              p_local._0_4_ = MbxIn._1020_4_ + (uint)p_local;
              FOEp = (ec_FOEt *)((long)FOEp - (long)(int)MbxIn._1020_4_);
              segmentdata = segmentdata + -1;
            }
          }
          else {
            sendpacket = -3;
          }
        }
        else {
          sendpacket = -3;
        }
      }
    } while (bVar1);
  }
  return sendpacket;
}

Assistant:

int ecx_FOEwrite(ecx_contextt *context, uint16 slave, char *filename, uint32 password, int psize, void *p, int timeout)
{
   ec_FOEt *FOEp, *aFOEp;
   int wkc;
   int32 packetnumber, sendpacket = 0;
   uint16 fnsize, maxdata;
   int segmentdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   boolean worktodo, dofinalzero;
   int tsize;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aFOEp = (ec_FOEt *)&MbxIn;
   FOEp = (ec_FOEt *)&MbxOut;
   dofinalzero = FALSE;
   fnsize = strlen(filename);
   maxdata = context->slavelist[slave].mbx_l - 12;
   if (fnsize > maxdata)
   {
      fnsize = maxdata;
   }
   FOEp->MbxHeader.length = htoes(0x0006 + fnsize);
   FOEp->MbxHeader.address = htoes(0x0000);
   FOEp->MbxHeader.priority = 0x00;
   /* get new mailbox count value, used as session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
   FOEp->OpCode = ECT_FOE_WRITE;
   FOEp->Password = htoel(password);
   /* copy filename in mailbox */
   memcpy(&FOEp->FileName[0], filename, fnsize);
   /* send FoE request to slave */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0) /* succeeded to place mailbox in slave ? */
   {
      do
      {   
         worktodo = FALSE;
         /* clean mailboxbuffer */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
         if (wkc > 0) /* succeeded to read slave response ? */
         {
            /* slave response should be FoE */
            if ((aFOEp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_FOE)
            {
               switch (aFOEp->OpCode)
               {
                  case ECT_FOE_ACK:
                  {
                     packetnumber = etohl(aFOEp->PacketNumber);
                     if (packetnumber == sendpacket)
                     {
                        if (context->FOEhook)
                        {
                           context->FOEhook(slave, packetnumber, psize);
                        }
                        tsize = psize;
                        if (tsize > maxdata)
                        {
                           tsize = maxdata;
                        }
                        if(tsize || dofinalzero)
                        {
                           worktodo = TRUE; 
                           dofinalzero = FALSE;
                           segmentdata = tsize;
                           psize -= segmentdata;
                           /* if last packet was full size, add a zero size packet as final */
                           /* EOF is defined as packetsize < full packetsize */
                           if (!psize && (segmentdata == maxdata))
                           {
                              dofinalzero = TRUE;
                           }
                           FOEp->MbxHeader.length = htoes(0x0006 + segmentdata);
                           FOEp->MbxHeader.address = htoes(0x0000);
                           FOEp->MbxHeader.priority = 0x00;
                           /* get new mailbox count value */
                           cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                           context->slavelist[slave].mbx_cnt = cnt;
                           FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
                           FOEp->OpCode = ECT_FOE_DATA;
                           sendpacket++;
                           FOEp->PacketNumber = htoel(sendpacket);
                           memcpy(&FOEp->Data[0], p, segmentdata);
                           p = (uint8 *)p + segmentdata;
                           /* send FoE data to slave */
                           wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                           if (wkc <= 0)
                           {   
                              worktodo = FALSE;
                           }
                        }
                     }
                     else
                     {
                        /* FoE error */
                        wkc = -EC_ERR_TYPE_FOE_PACKETNUMBER;
                     }
                     break;
                  }
                  case ECT_FOE_BUSY:
                  {
                     /* resend if data has been send before */
                     /* otherwise ignore */
                     if (sendpacket)
                     {
                        if (!psize)
                        {
                           dofinalzero = TRUE;
                        }
                        psize += segmentdata;
                        p = (uint8 *)p - segmentdata;
                        --sendpacket;
                     }
                     break;
                  }
                  case ECT_FOE_ERROR:
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_ERROR;
                     break;
                  }
                  default:
                  {
                     /* unexpected mailbox received */
                     wkc = -EC_ERR_TYPE_PACKET_ERROR;
                  }
               }
            }
            else
            {
               /* unexpected mailbox received */
               wkc = -EC_ERR_TYPE_PACKET_ERROR;
            }
         }
      } while (worktodo);   
   }
   
   return wkc;
}